

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecNorm.c
# Opt level: O3

Vec_Int_t * Acec_BuildTree(Gia_Man_t *pNew,Gia_Man_t *p,Vec_Wec_t *vLeafLits,Vec_Int_t *vRootLits)

{
  uint uVar1;
  void *__ptr;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar5;
  Vec_Int_t *pVVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  
  iVar10 = vLeafLits->nSize;
  p_00 = (Vec_Wec_t *)malloc(0x10);
  iVar2 = 8;
  if (6 < iVar10 - 1U) {
    iVar2 = iVar10;
  }
  p_00->nCap = iVar2;
  if (iVar2 == 0) {
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Int_t *)calloc((long)iVar2,0x10);
  }
  p_00->pArray = pVVar5;
  p_00->nSize = iVar10;
  if ((vRootLits != (Vec_Int_t *)0x0) && (0 < vRootLits->nSize)) {
    lVar9 = 0;
    lVar7 = 0;
    do {
      iVar10 = vRootLits->pArray[lVar7];
      if (lVar7 < p_00->nSize) {
        pVVar5 = (Vec_Int_t *)((long)&p_00->pArray->nCap + lVar9);
      }
      else {
        pVVar5 = Vec_WecPushLevel(p_00);
      }
      Vec_IntPush(pVVar5,iVar10);
      lVar7 = lVar7 + 1;
      lVar9 = lVar9 + 0x10;
    } while (lVar7 < vRootLits->nSize);
    iVar10 = vLeafLits->nSize;
  }
  if (0 < iVar10) {
    lVar7 = 0;
    do {
      pVVar5 = vLeafLits->pArray;
      if (0 < pVVar5[lVar7].nSize) {
        uVar3 = (int)lVar7 + 1;
        lVar9 = 0;
        do {
          uVar1 = pVVar5[lVar7].pArray[lVar9];
          if ((int)uVar1 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          if (p->nObjs <= (int)(uVar1 >> 1)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          uVar4 = Acec_InsertBox_rec(pNew,p,p->pObjs + (uVar1 >> 1));
          if ((int)uVar4 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          if (p_00->nSize <= lVar7) {
            uVar8 = p_00->nSize * 2;
            if ((int)uVar8 <= (int)uVar3) {
              uVar8 = uVar3;
            }
            iVar10 = p_00->nCap;
            if (iVar10 < (int)uVar8) {
              if (p_00->pArray == (Vec_Int_t *)0x0) {
                pVVar6 = (Vec_Int_t *)malloc((ulong)uVar8 << 4);
              }
              else {
                pVVar6 = (Vec_Int_t *)realloc(p_00->pArray,(ulong)uVar8 << 4);
              }
              p_00->pArray = pVVar6;
              memset(pVVar6 + iVar10,0,(long)(int)(uVar8 - iVar10) << 4);
              p_00->nCap = uVar8;
            }
            p_00->nSize = uVar3;
          }
          Vec_IntPush(p_00->pArray + lVar7,uVar4 ^ uVar1 & 1);
          lVar9 = lVar9 + 1;
        } while (lVar9 < pVVar5[lVar7].nSize);
        iVar10 = vLeafLits->nSize;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar10);
  }
  pVVar6 = Acec_InsertTree(pNew,p_00);
  iVar10 = p_00->nCap;
  pVVar5 = p_00->pArray;
  if ((long)iVar10 < 1) {
    if (pVVar5 == (Vec_Int_t *)0x0) goto LAB_00680f31;
  }
  else {
    lVar7 = 0;
    do {
      __ptr = *(void **)((long)&pVVar5->pArray + lVar7);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&pVVar5->pArray + lVar7) = 0;
      }
      lVar7 = lVar7 + 0x10;
    } while ((long)iVar10 * 0x10 != lVar7);
  }
  free(pVVar5);
LAB_00680f31:
  free(p_00);
  return pVVar6;
}

Assistant:

Vec_Int_t * Acec_BuildTree( Gia_Man_t * pNew, Gia_Man_t * p, Vec_Wec_t * vLeafLits, Vec_Int_t * vRootLits )
{
    Vec_Wec_t * vLeafMap = Vec_WecStart( Vec_WecSize(vLeafLits) );
    Vec_Int_t * vLevel, * vRootRanks;  
    int i, k, iLit, iLitNew;
    // add roo literals
    if ( vRootLits )
        Vec_IntForEachEntry( vRootLits, iLit, i )
        {
            if ( i < Vec_WecSize(vLeafMap) )
                vLevel = Vec_WecEntry(vLeafMap, i);
            else
                vLevel = Vec_WecPushLevel(vLeafMap);
            Vec_IntPush( vLevel, iLit );
        }
    // add other literals
    Vec_WecForEachLevel( vLeafLits, vLevel, i )
        Vec_IntForEachEntry( vLevel, iLit, k )
        {
            Gia_Obj_t * pObj = Gia_ManObj( p, Abc_Lit2Var(iLit) );
            iLitNew = Acec_InsertBox_rec( pNew, p, pObj );
            iLitNew = Abc_LitNotCond( iLitNew, Abc_LitIsCompl(iLit) );
            Vec_WecPush( vLeafMap, i, iLitNew );
        }
    // construct map of root literals
    vRootRanks = Acec_InsertTree( pNew, vLeafMap );
    Vec_WecFree( vLeafMap );
    return vRootRanks;
}